

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleRowDown2Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst,int dst_width)

{
  int iVar1;
  
  if (1 < dst_width) {
    iVar1 = 0;
    do {
      *dst = (uint16_t)
             ((uint)src_ptr[src_stride] + (uint)src_ptr[1] + (uint)*src_ptr +
              (uint)src_ptr[src_stride + 1] + 2 >> 2);
      dst[1] = (uint16_t)
               ((uint)src_ptr[src_stride + 2] + (uint)src_ptr[3] + (uint)src_ptr[2] +
                (uint)src_ptr[src_stride + 3] + 2 >> 2);
      dst = dst + 2;
      src_ptr = src_ptr + 4;
      iVar1 = iVar1 + 2;
    } while (iVar1 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *dst = (uint16_t)
           ((uint)(src_ptr + src_stride)[1] +
            (uint)src_ptr[src_stride] + (uint)src_ptr[1] + (uint)*src_ptr + 2 >> 2);
  }
  return;
}

Assistant:

void ScaleRowDown2Box_16_C(const uint16_t* src_ptr,
                           ptrdiff_t src_stride,
                           uint16_t* dst,
                           int dst_width) {
  const uint16_t* s = src_ptr;
  const uint16_t* t = src_ptr + src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
    dst[1] = (s[2] + s[3] + t[2] + t[3] + 2) >> 2;
    dst += 2;
    s += 4;
    t += 4;
  }
  if (dst_width & 1) {
    dst[0] = (s[0] + s[1] + t[0] + t[1] + 2) >> 2;
  }
}